

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::round_up_abs(char *ext,int keep_digits)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar3 = (ulong)keep_digits;
  iVar4 = keep_digits * 4;
  bVar2 = true;
  do {
    iVar4 = iVar4 + -4;
    uVar3 = uVar3 - 1;
    if (uVar3 == 0xffffffffffffffff) break;
    bVar6 = ext[(uVar3 >> 1) + 5];
    uVar7 = (uint)(int)(char)bVar6 >> (~(byte)iVar4 & 4);
    uVar5 = uVar7 & 0xf;
    if (uVar5 < 9) {
      bVar1 = (byte)uVar3 & 1;
      bVar6 = (byte)((uVar7 + 1 & 0xf) << (bVar1 * '\x04' ^ 4)) | '\x0f' << (bVar1 << 2) & bVar6;
      bVar2 = false;
    }
    else {
      bVar6 = '\x0f' << ((byte)iVar4 & 4) & bVar6;
    }
    ext[(uVar3 >> 1) + 5] = bVar6;
  } while (8 < uVar5);
  if (bVar2) {
    shift_right(ext,1);
    *(short *)(ext + 2) = *(short *)(ext + 2) + 1;
    ext[5] = ext[5] & 0xfU | 0x10;
  }
  ext[4] = ext[4] & 0xf7;
  return;
}

Assistant:

void CVmObjBigNum::round_up_abs(char *ext, int keep_digits)
{
    /* start with a "carry" into the least significant digit */
    int carry = TRUE;

    /* propagate the carry through the number's digits */
    for (int idx = keep_digits ; idx != 0 ; )
    {
        /* move to the next more significant digit */
        --idx;

        /* add the carry */
        int d = get_dig(ext, idx);
        if (d < 9)
        {
            /* bump it up */
            set_dig(ext, idx, d + 1);

            /* no carrying required, so we can stop now */
            carry = FALSE;
            break;
        }
        else
        {
            /* it's a '9', so bump it up to '0' and carry to the next digit */
            set_dig(ext, idx, 0);
        }
    }

    /* 
     *   If we carried out of the top digit, we must have had all nines, in
     *   which case we now have all zeros.  Put a 1 in the first digit and
     *   increase the exponent to renormalize. 
     */
    if (carry)
    {
        /* shift the mantissa */
        shift_right(ext, 1);

        /* increase the exponent */
        set_exp(ext, get_exp(ext) + 1);
        
        /* set the lead digit to 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is non-zero now */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}